

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MineFusing.cpp
# Opt level: O2

KString * __thiscall
KDIS::DATA_TYPE::MineFusing::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,MineFusing *this)

{
  ostream *poVar1;
  KINT32 Value;
  KINT32 Value_00;
  KStringStream ss;
  KString local_1e0;
  KString local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"MineFusing:");
  poVar1 = std::operator<<(poVar1,"\n\tPrimary Fuse:            ");
  ENUMS::GetEnumAsStringMineFuse_abi_cxx11_
            (&local_1c0,(ENUMS *)(ulong)((this->m_FuseUnion).m_ui16Fusing & 0x7f),Value);
  poVar1 = std::operator<<(poVar1,(string *)&local_1c0);
  poVar1 = std::operator<<(poVar1,"\n\tSecondary Fuse:          ");
  ENUMS::GetEnumAsStringMineFuse_abi_cxx11_
            (&local_1e0,(ENUMS *)(ulong)(*(uint *)&this->m_FuseUnion >> 7 & 0x7f),Value_00);
  poVar1 = std::operator<<(poVar1,(string *)&local_1e0);
  poVar1 = std::operator<<(poVar1,"\n\tAnti-Handling Device:    ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->m_FuseUnion).m_ui16Fusing >> 0xe & 1);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString MineFusing::GetAsString() const
{
    KStringStream ss;

    ss << "MineFusing:"
       << "\n\tPrimary Fuse:            " << GetEnumAsStringMineFuse( m_FuseUnion.m_ui16Primary )
       << "\n\tSecondary Fuse:          " << GetEnumAsStringMineFuse( m_FuseUnion.m_ui16Secondary )
       << "\n\tAnti-Handling Device:    " << m_FuseUnion.m_ui16AHD
       << "\n";

    return ss.str();
}